

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yy_identifier(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *cclass;
  char *extraout_RDX;
  char *cclass_00;
  char *extraout_RDX_00;
  
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar2 = yymatchClass(G,(uchar *)"",cclass);
  cclass_00 = extraout_RDX;
  if (iVar2 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar3 = 0;
  }
  else {
    do {
      iVar3 = G->pos;
      iVar1 = G->thunkpos;
      iVar2 = yymatchClass(G,(uchar *)"",cclass_00);
      cclass_00 = extraout_RDX_00;
    } while (iVar2 != 0);
    G->pos = iVar3;
    G->thunkpos = iVar1;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yy__(G);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

YY_RULE(int) yy_identifier(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "identifier"));
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l95;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\000\000\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z_")) goto l95;

  l96:;	
  {  int yypos97= G->pos, yythunkpos97= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z_0-9")) goto l97;
  goto l96;
  l97:;	  G->pos= yypos97; G->thunkpos= yythunkpos97;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l95;  if (!yy__(G))  goto l95;
  yyprintf((stderr, "  ok   identifier"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l95:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "identifier"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}